

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  bad_alloc *anon_var_0;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  undefined1 local_3d8 [8];
  aalcalc a;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  _union_1457 _Stack_138;
  sigaction sa;
  float local_90;
  bool local_89;
  float confidence_level;
  bool alct_output;
  string alct_outFile;
  string local_60 [7];
  bool parquet_output;
  string parquet_outFile;
  bool local_3f;
  bool local_3e;
  string local_38;
  bool ord_output;
  bool skipheader;
  bool debug;
  int opt;
  string subfolder;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  std::__cxx11::string::string(&local_38);
  bVar3 = false;
  local_3e = false;
  local_3f = false;
  std::__cxx11::string::string(local_60);
  bVar2 = false;
  std::__cxx11::string::string((string *)&confidence_level);
  local_89 = false;
  local_90 = 0.95;
  while (iVar5 = getopt(argc,argv,"svdohK:p:c:l:"), iVar5 != -1) {
    switch(iVar5) {
    case 0x4b:
      std::__cxx11::string::operator=(&local_38,_optarg);
      break;
    case 99:
      local_89 = true;
      std::__cxx11::string::operator=((string *)&confidence_level,_optarg);
      break;
    case 100:
      bVar3 = true;
      break;
    case 0x68:
    default:
      help();
      exit(1);
    case 0x6c:
      dVar1 = atof(_optarg);
      local_90 = (float)dVar1;
      break;
    case 0x6f:
      local_3f = true;
      break;
    case 0x70:
      bVar2 = true;
      std::__cxx11::string::operator=(local_60,_optarg);
      break;
    case 0x73:
      local_3e = true;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    }
  }
  lVar6 = std::__cxx11::string::length();
  if (lVar6 == 0) {
    fprintf(_stderr,"FATAL: No folder supplied for summarycalc files\n");
    exit(1);
  }
  if ((0.0 <= local_90) && (local_90 <= 1.0)) {
    if (bVar2) {
      fprintf(_stderr,
              "FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
             );
      exit(1);
    }
    sa.sa_mask.__val[0xe] = 0;
    sa.sa_mask.__val[0xf] = 0;
    sa.sa_mask.__val[0xc] = 0;
    sa.sa_mask.__val[0xd] = 0;
    sa.sa_mask.__val[10] = 0;
    sa.sa_mask.__val[0xb] = 0;
    sa.sa_mask.__val[8] = 0;
    sa.sa_mask.__val[9] = 0;
    sa.sa_mask.__val[6] = 0;
    sa.sa_mask.__val[7] = 0;
    sa.sa_mask.__val[4] = 0;
    sa.sa_mask.__val[5] = 0;
    sa.sa_mask.__val[2] = 0;
    sa.sa_mask.__val[3] = 0;
    sa.sa_mask.__val[0] = 0;
    sa.sa_mask.__val[1] = 0;
    _Stack_138.sa_handler = (__sighandler_t)0x0;
    sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
    sa.sa_flags = 0;
    sa._140_4_ = 0;
    sigemptyset((sigset_t *)&sa);
    _Stack_138.sa_handler = segfault_sigaction;
    sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
    sigaction(0xb,(sigaction *)&_Stack_138,(sigaction *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"",(allocator *)&a.field_0x24f);
    initstreams((string *)local_158,(string *)local_180);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&a.field_0x24f);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::string(local_3f8,local_60);
    std::__cxx11::string::string(local_418,(string *)&confidence_level);
    aalcalc::aalcalc((aalcalc *)local_3d8,local_3e,local_3f,false,(string *)local_3f8,local_89,
                     (string *)local_418,local_90);
    std::__cxx11::string::~string(local_418);
    std::__cxx11::string::~string(local_3f8);
    if (bVar3) {
      aalcalc::debug((aalcalc *)local_3d8,(string *)&local_38);
    }
    pcVar4 = progname;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_438,pcVar4,&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"INFO",&local_461);
    logprintf((string *)local_438,(string *)local_460,"starting process..\n");
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator((allocator<char> *)&local_439);
    aalcalc::doit((aalcalc *)local_3d8,(string *)&local_38);
    pcVar4 = progname;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_488,pcVar4,&local_489);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b0,"INFO",(allocator *)((long)&anon_var_0 + 7));
    logprintf((string *)local_488,(string *)local_4b0,"finishing process..\n");
    std::__cxx11::string::~string(local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    std::__cxx11::string::~string(local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    aalcalc::~aalcalc((aalcalc *)local_3d8);
    std::__cxx11::string::~string((string *)&confidence_level);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(&local_38);
    return 0;
  }
  fprintf(_stderr,"FATAL: Confidence level must lie between 0 and 1\n");
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	std::string subfolder;
	int opt;
	bool debug = false;
	bool skipheader = false;
	bool ord_output = false;   // csv output
	std::string parquet_outFile;   // parquet output
	bool parquet_output = false;   // parquet output
	std::string alct_outFile;   // Average Loss Convergence Table (ALCT)
	bool alct_output = false;   // ALCT
	float confidence_level = 0.95;
	while ((opt = getopt(argc, argv, (char *)"svdohK:p:c:l:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 's':
			skipheader = true;
			break;
		case 'K':
			subfolder = optarg;
			break;
		case 'o':
			ord_output = true;
			break;
		case 'p':
			parquet_output = true;
			parquet_outFile = optarg;
			break;
		case 'c':
			alct_output = true;
			alct_outFile = optarg;
			break;
		case 'l':
			confidence_level = atof(optarg);
			break;
		case 'd':
			debug = true;			
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

	if (subfolder.length() == 0) {
		fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
		exit(EXIT_FAILURE);
	}

	if (confidence_level < 0.0 || confidence_level > 1.0) {
		fprintf(stderr, "FATAL: Confidence level must lie between 0 and 1\n");
		exit(EXIT_FAILURE);
	}

#ifndef HAVE_PARQUET
	if (parquet_output) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet output are missing.\n"
				"Please install libraries and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	initstreams();

	
	try {
		aalcalc a(skipheader, ord_output, parquet_output,
			  parquet_outFile, alct_output, alct_outFile,
			  confidence_level);
		if (debug == true) {
			a.debug(subfolder);
		}
        	logprintf(progname, "INFO", "starting process..\n");
        	a.doit(subfolder);
        	logprintf(progname, "INFO", "finishing process..\n");
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}


	return EXIT_SUCCESS;

}